

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::AddressBook::MergeFrom(AddressBook *this,Message *from)

{
  LogMessage *pLVar1;
  AddressBook *from_00;
  AddressBook *source;
  byte local_51;
  LogMessage local_50 [56];
  Message *local_18;
  Message *from_local;
  AddressBook *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = &this->super_Message;
  if ((AddressBook *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O0/proto/messages.pb.cc"
               ,0x3bf);
    local_51 = 1;
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&source + 3),pLVar1);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
  }
  from_00 = google::protobuf::DynamicCastToGenerated<Messages::AddressBook>(local_18);
  if (from_00 == (AddressBook *)0x0) {
    google::protobuf::internal::ReflectionOps::Merge(local_18,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void AddressBook::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:Messages.AddressBook)
  GOOGLE_DCHECK_NE(&from, this);
  const AddressBook* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<AddressBook>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:Messages.AddressBook)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:Messages.AddressBook)
    MergeFrom(*source);
  }
}